

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O0

void __thiscall
tf::
Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_deferred_pipelines.cpp:355:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_deferred_pipelines.cpp:385:40)>_>
::_check_dependents(Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_deferred_pipelines_cpp:355:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_deferred_pipelines_cpp:385:40)>_>
                    *this,Pipeflow *pf)

{
  bool bVar1;
  reference puVar2;
  unsigned_long *puVar3;
  long in_RSI;
  long in_RDI;
  iterator pit;
  iterator it;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffff98;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffa0;
  _Node_iterator_base<unsigned_long,_false> in_stack_ffffffffffffffa8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  _Node_iterator_base<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false> local_28;
  _Node_iterator_base<unsigned_long,_false> local_20;
  _Node_iterator_base<unsigned_long,_false> local_18 [3];
  
  *(long *)(in_RSI + 0x20) = *(long *)(in_RSI + 0x20) + 1;
  local_18[0]._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
       ::begin(in_stack_ffffffffffffff98);
  while( true ) {
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::__detail::operator!=(local_18,&local_20);
    if (!bVar1) break;
    puVar2 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                       ((_Node_iterator<unsigned_long,_true,_false> *)0x147461);
    if (*puVar2 < *(ulong *)(in_RDI + 0x18)) {
      in_stack_ffffffffffffffa0 =
           (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            *)(in_RDI + 0x158);
      std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                ((_Node_iterator<unsigned_long,_true,_false> *)0x14750d);
      local_28._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
           ::find((unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
                   *)in_stack_ffffffffffffff98,(key_type *)0x14751a);
      local_30._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
           ::end((unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
                  *)in_stack_ffffffffffffff98);
      bVar1 = std::__detail::operator!=(&local_28,&local_30);
      if (bVar1) {
        in_stack_ffffffffffffff98 =
             (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)(in_RDI + 0x120);
        std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                  ((_Node_iterator<unsigned_long,_true,_false> *)0x147563);
        std::
        unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::operator[]((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      *)in_stack_ffffffffffffffa0,(key_type *)in_stack_ffffffffffffff98);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (in_stack_ffffffffffffffb0,
                   (value_type_conflict2 *)in_stack_ffffffffffffffa8._M_cur);
        std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                  ((_Node_iterator<unsigned_long,_true,_false> *)in_stack_ffffffffffffffa0);
      }
      else {
        local_18[0]._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::erase(in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8._M_cur);
      }
    }
    else {
      in_stack_ffffffffffffffa8._M_cur = (__node_type *)(in_RDI + 0x120);
      std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                ((_Node_iterator<unsigned_long,_true,_false> *)0x14748d);
      std::
      unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::operator[]((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)in_stack_ffffffffffffffa0,(key_type *)in_stack_ffffffffffffff98);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (in_stack_ffffffffffffffb0,(value_type_conflict2 *)in_stack_ffffffffffffffa8._M_cur)
      ;
      in_stack_ffffffffffffffb0 =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 400);
      puVar2 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                         ((_Node_iterator<unsigned_long,_true,_false> *)0x1474c5);
      puVar3 = std::max<unsigned_long>((unsigned_long *)in_stack_ffffffffffffffb0,puVar2);
      *(unsigned_long *)(in_RDI + 400) = *puVar3;
      std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                ((_Node_iterator<unsigned_long,_true,_false> *)in_stack_ffffffffffffffa0);
    }
  }
  return;
}

Assistant:

void Pipeline<Ps...>::_check_dependents(Pipeflow& pf) {
  //if (pf._dependents.size()) {
  ++pf._num_deferrals;
  
  for (auto it = pf._dependents.begin(); it != pf._dependents.end();) {
 
    // valid (e.g., 12.defer(16)) 
    if (*it >= _num_tokens) {
      _token_dependencies[*it].push_back(pf._token);
      _longest_deferral = std::max(_longest_deferral, *it);
      ++it;
    }
    // valid or invalid (e.g., 12.defer(7))
    else {
      auto pit = _deferred_tokens.find(*it);
      
      // valid (e.g., 7 is deferred)
      if (pit != _deferred_tokens.end()) {
        _token_dependencies[*it].push_back(pf._token);
        ++it;
      }

      // invalid (e.g., 7 is finished - this this 12.defer(7) is dummy)
      else {
        it = pf._dependents.erase(it);
      }
    }
  }
}